

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary_unix.cpp
# Opt level: O3

bool __thiscall QLibraryPrivate::load_sys(QLibraryPrivate *this)

{
  QMutex *this_00;
  int iVar1;
  __pointer_type pQVar2;
  uint uVar3;
  QArrayData *pQVar4;
  DataPointer *pDVar5;
  Data *pDVar6;
  Data *pDVar7;
  bool bVar8;
  qsizetype qVar9;
  QString *pQVar10;
  __pointer_type pvVar11;
  QString *pQVar12;
  char16_t *pcVar13;
  QString *pQVar14;
  long lVar15;
  char *pcVar16;
  int prefix;
  ulong uVar17;
  long in_FS_OFFSET;
  bool bVar18;
  QLatin1StringView str;
  QLatin1StringView rhs;
  QLatin1StringView str_00;
  QByteArrayView ba;
  QStringView lhs;
  QFileSystemEntry fsEntry;
  QString local_170;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&>,_const_QString_&>
  local_158;
  QArrayDataPointer<QString> local_138;
  QArrayDataPointer<QString> local_118;
  QString local_f8;
  QString local_d8;
  QString local_b8;
  QArrayDataPointer<QString> local_98;
  undefined1 local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar18 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar18) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar18) goto LAB_00496cec;
  }
  else {
LAB_00496cec:
    QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
  }
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_78,&this->fileName);
  local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::path(&local_d8,(QFileSystemEntry *)local_78);
  local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::fileName(&local_f8,(QFileSystemEntry *)local_78);
  if ((((undefined1 *)local_d8.d.size != (undefined1 *)0x1) ||
      (rhs.m_data = ".", rhs.m_size = 1, lhs.m_data = local_d8.d.ptr, lhs.m_size = 1,
      bVar18 = QtPrivate::equalStrings(lhs,rhs), !bVar18)) ||
     (bVar18 = QString::startsWith(&this->fileName,&local_d8,CaseSensitive), pDVar6 = local_d8.d.d,
     bVar18)) {
    QString::append(&local_d8,(QChar)0x2f);
  }
  else if (local_d8.d.ptr != (storage_type_conflict *)0x0) {
    local_d8.d.d = (Data *)0x0;
    local_d8.d.ptr = (storage_type_conflict *)0x0;
    local_d8.d.size = 0;
    if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
      }
    }
  }
  local_118.d = (Data *)0x0;
  local_118.ptr = (QString *)0x0;
  local_118.size = 0;
  local_138.size = 0;
  local_138.d = (Data *)0x0;
  local_138.ptr = (QString *)0x0;
  if (this->pluginState != IsAPlugin) {
    QString::QString((QString *)&local_158,(QChar *)L"lib",3);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_138,local_138.size,(QString *)&local_158);
    QList<QString>::end((QList<QString> *)&local_138);
    if ((QArrayData *)local_158.a.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate((QArrayData *)local_158.a.a.a,2,0x10);
      }
    }
    suffixes_sys((QStringList *)&local_98,&this->fullVersion);
    qVar9 = local_98.size;
    pQVar14 = local_98.ptr;
    pDVar7 = local_98.d;
    local_158.a.b = (QString *)local_118.size;
    local_158.a.a.b = local_118.ptr;
    local_158.a.a.a = (QString *)local_118.d;
    local_98.size = 0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (QString *)0x0;
    local_118.d = pDVar7;
    local_118.ptr = pQVar14;
    local_118.size = qVar9;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_158);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  }
  uVar3 = (this->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  bVar18 = QFileSystemEntry::isAbsolute((QFileSystemEntry *)local_78);
  if (bVar18) {
    local_158.a.a.a = (QString *)0x0;
    local_158.a.a.b = (QString *)0x0;
    local_158.a.b = (QString *)0x0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_118,0,(QString *)&local_158);
    if ((QArrayData *)local_158.a.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate((QArrayData *)local_158.a.a.a,2,0x10);
      }
    }
    local_158.a.a.a = (QString *)0x0;
    local_158.a.a.b = (QString *)0x0;
    local_158.a.b = (QString *)0x0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_138,0,(QString *)&local_158);
  }
  else {
    local_158.a.a.a = (QString *)0x0;
    local_158.a.a.b = (QString *)0x0;
    local_158.a.b = (QString *)0x0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_118,local_118.size,(QString *)&local_158);
    QList<QString>::end((QList<QString> *)&local_118);
    if ((QArrayData *)local_158.a.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate((QArrayData *)local_158.a.a.a,2,0x10);
      }
    }
    local_158.a.a.a = (QString *)0x0;
    local_158.a.a.b = (QString *)0x0;
    local_158.a.b = (QString *)0x0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_138,local_138.size,(QString *)&local_158);
    QList<QString>::end((QList<QString> *)&local_138);
  }
  if ((QArrayData *)local_158.a.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_158.a.a.a,2,0x10);
    }
  }
  if ((~(uint)qt_cpu_features[0].super___atomic_base<unsigned_long>._M_i & 0x76ff) == 0) {
    if (this->pluginState == IsAPlugin) {
      local_158.a.a.a = (QString *)0x0;
      local_158.a.a.b = (QString *)0x0;
      local_158.a.b = (QString *)0x0;
      qSwap<QList<QString>>((QList<QString> *)&local_158,(QList<QString> *)&local_118);
      QList<QString>::reserve((QList<QString> *)&local_118,(long)local_158.a.b * 2);
      if (local_158.a.b != (QString *)0x0) {
        pQVar14 = local_158.a.a.b + (long)local_158.a.b;
        pQVar12 = local_158.a.a.b;
        do {
          local_98.d = (Data *)(pQVar12->d).d;
          local_98.ptr = (QString *)(pQVar12->d).ptr;
          local_98.size = (pQVar12->d).size;
          if ((QArrayData *)local_98.d != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_98.d)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_98.d)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          str.m_data = ".avx2";
          str.m_size = 5;
          QString::append((QString *)&local_98,str);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_118,local_118.size,(QString *)&local_98);
          QList<QString>::end((QList<QString> *)&local_118);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_118,local_118.size,pQVar12);
          QList<QString>::end((QList<QString> *)&local_118);
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
            }
          }
          pQVar12 = pQVar12 + 1;
        } while (pQVar12 != pQVar14);
      }
    }
    else {
      local_158.a.a.a = (QString *)0x0;
      local_158.a.a.b = (QString *)0x0;
      local_158.a.b = (QString *)0x0;
      qSwap<QList<QString>>((QList<QString> *)&local_158,(QList<QString> *)&local_138);
      QList<QString>::reserve((QList<QString> *)&local_138,(long)local_158.a.b * 2);
      if (local_158.a.b != (QString *)0x0) {
        pQVar14 = local_158.a.a.b + (long)local_158.a.b;
        pQVar12 = local_158.a.a.b;
        do {
          local_98.d = (Data *)(pQVar12->d).d;
          local_98.ptr = (QString *)(pQVar12->d).ptr;
          local_98.size = (pQVar12->d).size;
          if ((QArrayData *)local_98.d != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_98.d)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_98.d)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          str_00.m_data = "glibc-hwcaps/x86-64-v3/";
          str_00.m_size = 0x17;
          QString::insert((QString *)&local_98,0,str_00);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_138,local_138.size,(QString *)&local_98);
          QList<QString>::end((QList<QString> *)&local_138);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_138,local_138.size,pQVar12);
          QList<QString>::end((QList<QString> *)&local_138);
          if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
            }
          }
          pQVar12 = pQVar12 + 1;
        } while (pQVar12 != pQVar14);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_158);
  }
  LOCK();
  pQVar2 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar2 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,pQVar2);
  }
  bVar18 = true;
  uVar17 = 0;
  while ((uVar17 < (ulong)local_138.size && (bVar18))) {
    pQVar14 = (QString *)0xffffffffffffffff;
    lVar15 = 0;
    do {
      pQVar14 = (QString *)((long)&(pQVar14->d).d + 1);
      if ((ulong)local_118.size <= pQVar14) break;
      if ((((undefined1 *)local_d8.d.size != (undefined1 *)0x0) ||
          (qVar9 = QString::indexOf(local_138.ptr + uVar17,(QChar)0x2f,0,CaseSensitive), qVar9 == -1
          )) && ((*(long *)((long)&((local_118.ptr)->d).size + lVar15) == 0 ||
                 (bVar8 = QString::endsWith(&local_f8,
                                            (QString *)((long)&((local_118.ptr)->d).d + lVar15),
                                            CaseSensitive), !bVar8)))) {
        if ((uVar3 & 4) == 0) {
          local_158.a.a.b = local_138.ptr + uVar17;
          local_158.b = (QString *)((long)&((local_118.ptr)->d).d + lVar15);
          local_158.a.a.a = &local_d8;
          local_158.a.b = &local_f8;
          QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&>,_const_QString_&>
          ::convertTo<QString>((QString *)&local_98,&local_158);
          qVar9 = local_98.size;
          pDVar7 = local_98.d;
          pcVar13 = local_b8.d.ptr;
          pDVar6 = local_b8.d.d;
          local_98.d = (Data *)local_b8.d.d;
          local_b8.d.d = (Data *)pDVar7;
          local_b8.d.ptr = (char16_t *)local_98.ptr;
          local_98.ptr = (QString *)pcVar13;
          local_98.size = local_b8.d.size;
          local_b8.d.size = qVar9;
          if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            iVar1 = (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
            UNLOCK();
            pQVar4 = &(local_98.d)->super_QArrayData;
joined_r0x004974d0:
            if (iVar1 == 0) {
              QArrayData::deallocate(pQVar4,2,0x10);
            }
          }
        }
        else {
          QString::operator=(&local_b8,&local_f8);
          pQVar10 = (QString *)QString::indexOf(&local_b8,(QChar)0x28,0,CaseSensitive);
          pQVar12 = local_138.ptr;
          if (pQVar10 == (QString *)0xffffffffffffffff) {
            pQVar10 = (QString *)local_b8.d.size;
          }
          pcVar13 = *(char16_t **)((long)&((local_118.ptr)->d).ptr + lVar15);
          if ((QChar *)pcVar13 == (QChar *)0x0) {
            pcVar13 = &QString::_empty;
          }
          local_98.size =
               (qsizetype)
               QString::insert(&local_b8,(qsizetype)pQVar10,(QChar *)pcVar13,
                               *(qsizetype *)((long)&((local_118.ptr)->d).size + lVar15));
          local_98.ptr = pQVar12 + uVar17;
          local_98.d = (Data *)&local_d8;
          QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&>::convertTo<QString>
                    ((QString *)&local_158,
                     (QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_QString_&> *)
                     &local_98);
          qVar9 = local_b8.d.size;
          pcVar13 = local_b8.d.ptr;
          pQVar4 = &(local_b8.d.d)->super_QArrayData;
          pQVar10 = local_158.a.b;
          pQVar12 = local_158.a.a.a;
          local_158.a.a.a = (QString *)local_b8.d.d;
          local_b8.d.d = (Data *)pQVar12;
          local_b8.d.ptr = (char16_t *)local_158.a.a.b;
          local_158.a.a.b = (QString *)pcVar13;
          local_158.a.b = (QString *)local_b8.d.size;
          local_b8.d.size = (qsizetype)pQVar10;
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (((Data *)pQVar4)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (((Data *)pQVar4)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            iVar1 = (((Data *)pQVar4)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            ;
            UNLOCK();
            local_158.a.a.a = (QString *)pQVar4;
            local_158.a.b = (QString *)qVar9;
            goto joined_r0x004974d0;
          }
        }
        QString::toLocal8Bit_helper
                  ((QByteArray *)&local_158,(QChar *)local_b8.d.ptr,local_b8.d.size);
        pcVar16 = (char *)local_158.a.a.b;
        if (local_158.a.a.b == (QString *)0x0) {
          pcVar16 = &QByteArray::_empty;
        }
        pvVar11 = (__pointer_type)
                  dlopen(pcVar16,(uVar3 & 1) +
                                 ((uVar3 & 8) << 9 | uVar3 >> 1 & 8 | (uVar3 & 2) << 7) + 1);
        if ((QArrayData *)local_158.a.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_158.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate((QArrayData *)local_158.a.a.a,1,0x10);
          }
        }
        if (pvVar11 != (__pointer_type)0x0) {
          bVar18 = true;
          goto LAB_0049759d;
        }
        bVar8 = QString::startsWith(&this->fileName,(QChar)0x2f,CaseSensitive);
        if ((bVar8) && (bVar8 = QFile::exists(&local_b8), bVar8)) {
          bVar18 = false;
        }
      }
      lVar15 = lVar15 + 0x18;
    } while (bVar18);
    uVar17 = uVar17 + 1;
    if (!bVar18) break;
  }
  pvVar11 = (__pointer_type)0x0;
  bVar18 = false;
LAB_0049759d:
  if ((this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar8 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar8) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar8) goto LAB_004975c2;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_004975c2:
  if (bVar18 == false) {
    pQVar14 = (QString *)0x0;
    QMetaObject::tr((QString *)&local_98,&QLibrary::staticMetaObject,"Cannot load library %1: %2",
                    (char *)0x0,-1);
    lVar15 = dlerror();
    if (lVar15 == 0) {
      pQVar12 = (QString *)0x0;
    }
    else {
      pQVar12 = (QString *)0xffffffffffffffff;
      do {
        pQVar14 = (QString *)((long)&(pQVar12->d).d + 1);
        pDVar5 = &pQVar12->d;
        pQVar12 = pQVar14;
      } while (*(char *)((long)&pDVar5->d + lVar15 + 1) != '\0');
    }
    ba.m_data = (storage_type *)pQVar14;
    ba.m_size = lVar15;
    QString::fromLocal8Bit(&local_170,pQVar12,ba);
    QString::arg<QString_const&,QString>
              ((type *)&local_158,(QString *)&local_98,&this->fileName,&local_170);
    pQVar4 = &((this->errorString).d.d)->super_QArrayData;
    pQVar14 = (QString *)(this->errorString).d.ptr;
    (this->errorString).d.d = (Data *)local_158.a.a.a;
    (this->errorString).d.ptr = (char16_t *)local_158.a.a.b;
    pQVar12 = (QString *)(this->errorString).d.size;
    (this->errorString).d.size = (qsizetype)local_158.a.b;
    local_158.a.a.a = (QString *)pQVar4;
    local_158.a.a.b = pQVar14;
    local_158.a.b = pQVar12;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar7 = local_98.d;
    if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
      }
    }
    pvVar11 = (__pointer_type)0x0;
  }
  else {
    QString::operator=(&this->qualifiedFileName,&local_b8);
    if ((this->errorString).d.ptr != (char16_t *)0x0) {
      pQVar4 = &((this->errorString).d.d)->super_QArrayData;
      (this->errorString).d.d = (Data *)0x0;
      (this->errorString).d.ptr = (char16_t *)0x0;
      (this->errorString).d.size = 0;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
  }
  (this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p = pvVar11;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_118);
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._24_8_,1,0x10);
    }
  }
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  pDVar6 = local_b8.d.d;
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  LOCK();
  pQVar2 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar2 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,pQVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar18;
  }
  __stack_chk_fail();
}

Assistant:

bool QLibraryPrivate::load_sys()
{
#if defined(Q_OS_WASM) && defined(QT_STATIC)
    // emscripten does not support dlopen when using static linking
    return false;
#endif

    QMutexLocker locker(&mutex);
    QString attempt;
    QFileSystemEntry fsEntry(fileName);

    QString path = fsEntry.path();
    QString name = fsEntry.fileName();
    if (path == "."_L1 && !fileName.startsWith(path))
        path.clear();
    else
        path += u'/';

    QStringList suffixes;
    QStringList prefixes;
    if (pluginState != IsAPlugin) {
        prefixes << prefix_sys().toString();
        suffixes = suffixes_sys(fullVersion);
    }
    int dlFlags = 0;
    auto loadHints = this->loadHints();
    if (loadHints & QLibrary::ResolveAllSymbolsHint) {
        dlFlags |= RTLD_NOW;
    } else {
        dlFlags |= RTLD_LAZY;
    }
    if (loadHints & QLibrary::ExportExternalSymbolsHint) {
        dlFlags |= RTLD_GLOBAL;
    }
#if !defined(Q_OS_CYGWIN)
    else {
        dlFlags |= RTLD_LOCAL;
    }
#endif
#if defined(RTLD_DEEPBIND)
    if (loadHints & QLibrary::DeepBindHint)
        dlFlags |= RTLD_DEEPBIND;
#endif

    // Provide access to RTLD_NODELETE flag on Unix
    // From GNU documentation on RTLD_NODELETE:
    // Do not unload the library during dlclose(). Consequently, the
    // library's specific static variables are not reinitialized if the
    // library is reloaded with dlopen() at a later time.
#if defined(RTLD_NODELETE)
    if (loadHints & QLibrary::PreventUnloadHint) {
#   ifdef Q_OS_ANDROID // RTLD_NODELETE flag is supported by Android 23+
        if (QtAndroidPrivate::androidSdkVersion() > 22)
#   endif
            dlFlags |= RTLD_NODELETE;
    }
#endif

#if defined(Q_OS_AIX)   // Not sure if any other platform actually support this thing.
    if (loadHints & QLibrary::LoadArchiveMemberHint) {
        dlFlags |= RTLD_MEMBER;
    }
#endif

    // If the filename is an absolute path then we want to try that first as it is most likely
    // what the callee wants. If we have been given a non-absolute path then lets try the
    // native library name first to avoid unnecessary calls to dlopen().
    if (fsEntry.isAbsolute()) {
        suffixes.prepend(QString());
        prefixes.prepend(QString());
    } else {
        suffixes.append(QString());
        prefixes.append(QString());
    }

#if defined(Q_PROCESSOR_X86) && !defined(Q_OS_DARWIN)
    if (qCpuHasFeature(ArchHaswell)) {
        auto transform = [](QStringList &list, void (*f)(QString *)) {
            QStringList tmp;
            qSwap(tmp, list);
            list.reserve(tmp.size() * 2);
            for (const QString &s : std::as_const(tmp)) {
                QString modifiedPath = s;
                f(&modifiedPath);
                list.append(modifiedPath);
                list.append(s);
            }
        };
        if (pluginState == IsAPlugin) {
            // add ".avx2" to each suffix in the list
            transform(suffixes, [](QString *s) { s->append(".avx2"_L1); });
        } else {
#  ifdef __GLIBC__
            // prepend "glibc-hwcaps/x86-64-v3/" to each prefix in the list
            transform(prefixes, [](QString *s) { s->prepend("glibc-hwcaps/x86-64-v3/"_L1); });
#  endif
        }
    }
#endif

    locker.unlock();
    bool retry = true;
    Handle hnd = nullptr;
    for (int prefix = 0; retry && !hnd && prefix < prefixes.size(); prefix++) {
        for (int suffix = 0; retry && !hnd && suffix < suffixes.size(); suffix++) {
            if (path.isEmpty() && prefixes.at(prefix).contains(u'/'))
                continue;
            if (!suffixes.at(suffix).isEmpty() && name.endsWith(suffixes.at(suffix)))
                continue;
            if (loadHints & QLibrary::LoadArchiveMemberHint) {
                attempt = name;
                qsizetype lparen = attempt.indexOf(u'(');
                if (lparen == -1)
                    lparen = attempt.size();
                attempt = path + prefixes.at(prefix) + attempt.insert(lparen, suffixes.at(suffix));
            } else {
                attempt = path + prefixes.at(prefix) + name + suffixes.at(suffix);
            }

            hnd = dlopen(QFile::encodeName(attempt), dlFlags);
#ifdef Q_OS_ANDROID
            if (!hnd) {
                auto attemptFromBundle = attempt;
                hnd = dlopen(QFile::encodeName(attemptFromBundle.replace(u'/', u'_')), dlFlags);
            }
#endif

            if (!hnd && fileName.startsWith(u'/') && QFile::exists(attempt)) {
                // We only want to continue if dlopen failed due to that the shared library did not exist.
                // However, we are only able to apply this check for absolute filenames (since they are
                // not influenced by the content of LD_LIBRARY_PATH, /etc/ld.so.cache, DT_RPATH etc...)
                // This is all because dlerror is flawed and cannot tell us the reason why it failed.
                retry = false;
            }
        }
    }

#ifdef Q_OS_DARWIN
    if (!hnd) {
        QByteArray utf8Bundle = fileName.toUtf8();
        QCFType<CFURLRef> bundleUrl = CFURLCreateFromFileSystemRepresentation(NULL, reinterpret_cast<const UInt8*>(utf8Bundle.data()), utf8Bundle.length(), true);
        QCFType<CFBundleRef> bundle = CFBundleCreate(NULL, bundleUrl);
        if (bundle) {
            QCFType<CFURLRef> url = CFBundleCopyExecutableURL(bundle);
            char executableFile[FILENAME_MAX];
            CFURLGetFileSystemRepresentation(url, true, reinterpret_cast<UInt8*>(executableFile), FILENAME_MAX);
            attempt = QString::fromUtf8(executableFile);
            hnd = dlopen(QFile::encodeName(attempt), dlFlags);
        }
    }
#endif

    locker.relock();
    if (!hnd) {
        errorString = QLibrary::tr("Cannot load library %1: %2")
                .arg(fileName, QString::fromLocal8Bit(dlerror()));
    }
    if (hnd) {
        qualifiedFileName = attempt;
        errorString.clear();
    }
    pHnd.storeRelaxed(hnd);
    return (hnd != nullptr);
}